

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O2

bool __thiscall DyndepLoader::LoadDyndeps(DyndepLoader *this,Node *node,DyndepFile *ddf,string *err)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  pointer ppEVar6;
  DyndepLoader *this_00;
  Edge *edge;
  Edge *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  node->dyndep_pending_ = false;
  if (g_explaining == true) {
    fprintf(_stderr,"ninja explain: loading dyndep file \'%s\'\n",(node->env_path_)._M_dataplus._M_p
           );
  }
  bVar3 = LoadDyndepFile(this,node,ddf,err);
  if (bVar3) {
    p_Var1 = &(ddf->
              super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
              )._M_t._M_impl.super__Rb_tree_header;
    for (ppEVar6 = (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppEVar6 !=
        (node->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar6 = ppEVar6 + 1) {
      local_b8 = *ppEVar6;
      if (local_b8->dyndep_ == node) {
        this_00 = (DyndepLoader *)ddf;
        iVar4 = std::
                _Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Dyndeps>,_std::_Select1st<std::pair<Edge_*const,_Dyndeps>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
                        *)ddf,&local_b8);
        if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
          std::operator+(&local_70,"\'",
                         &(*(local_b8->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start)->env_path_);
          std::operator+(&local_b0,&local_70,"\' not mentioned in its dyndep file \'");
          std::operator+(&local_90,&local_b0,&node->env_path_);
          std::operator+(&local_50,&local_90,"\'");
          goto LAB_0010f557;
        }
        *(undefined1 *)&iVar4._M_node[1]._M_parent = 1;
        bVar3 = UpdateEdge(this_00,local_b8,(Dyndeps *)&iVar4._M_node[1]._M_parent,err);
        if (!bVar3) goto LAB_0010f58d;
      }
    }
    p_Var5 = (ddf->
             super_map<Edge_*,_Dyndeps,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Dyndeps>_>_>
             )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0010f472:
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      if (*(char *)&p_Var5[1]._M_parent != '\0') goto code_r0x0010f47d;
      lVar2 = *(long *)(p_Var5 + 1);
      std::operator+(&local_70,"dyndep file \'",&node->env_path_);
      std::operator+(&local_b0,&local_70,"\' mentions output \'");
      std::operator+(&local_90,&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (**(long **)(lVar2 + 0x28) + 8));
      std::operator+(&local_50,&local_90,
                     "\' whose build statement does not have a dyndep binding for the file");
LAB_0010f557:
      std::__cxx11::string::operator=((string *)err,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_0010f58d;
    }
    bVar3 = true;
  }
  else {
LAB_0010f58d:
    bVar3 = false;
  }
  return bVar3;
code_r0x0010f47d:
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  goto LAB_0010f472;
}

Assistant:

bool DyndepLoader::LoadDyndeps(Node* node, DyndepFile* ddf,
                               std::string* err) const {
  // We are loading the dyndep file now so it is no longer pending.
  node->set_dyndep_pending(false);

  // Load the dyndep information from the file.
  EXPLAIN("loading dyndep file '%s'", node->path().c_str());
  if (!LoadDyndepFile(node, ddf, err))
    return false;

  // Update each edge that specified this node as its dyndep binding.
  std::vector<Edge*> const& out_edges = node->out_edges();
  for (std::vector<Edge*>::const_iterator oe = out_edges.begin();
       oe != out_edges.end(); ++oe) {
    Edge* const edge = *oe;
    if (edge->dyndep_ != node)
      continue;

    DyndepFile::iterator ddi = ddf->find(edge);
    if (ddi == ddf->end()) {
      *err = ("'" + edge->outputs_[0]->path() + "' "
              "not mentioned in its dyndep file "
              "'" + node->path() + "'");
      return false;
    }

    ddi->second.used_ = true;
    Dyndeps const& dyndeps = ddi->second;
    if (!UpdateEdge(edge, &dyndeps, err)) {
      return false;
    }
  }

  // Reject extra outputs in dyndep file.
  for (DyndepFile::const_iterator oe = ddf->begin(); oe != ddf->end();
       ++oe) {
    if (!oe->second.used_) {
      Edge* const edge = oe->first;
      *err = ("dyndep file '" + node->path() + "' mentions output "
              "'" + edge->outputs_[0]->path() + "' whose build statement "
              "does not have a dyndep binding for the file");
      return false;
    }
  }

  return true;
}